

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

size_type __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
::erase<unsigned_int>
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
           *this,key_arg<unsigned_int> *key)

{
  bool bVar1;
  iterator it;
  
  it = find<unsigned_int>(this,key,SUB168(ZEXT416(*key) * ZEXT816(0xde5fb9d2630458e9),8) +
                                   SUB168(ZEXT416(*key) * ZEXT816(0xde5fb9d2630458e9),0));
  bVar1 = it.ctrl_ != this->ctrl_ + this->capacity_;
  if (bVar1) {
    _erase(this,it);
  }
  return (ulong)bVar1;
}

Assistant:

size_t operator()(const K& key, Args&&...) const {
            return phmap_mix<sizeof(size_t)>()(h(key));
        }